

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O3

void __thiscall
Jinx::Impl::Library::RegisterFunctionSignature(Library *this,FunctionSignature *signature)

{
  int iVar1;
  __normal_iterator<Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  _Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_functionMutex);
  if (iVar1 == 0) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,__gnu_cxx::__ops::_Iter_equals_val<Jinx::Impl::FunctionSignature_const>>
                      ((this->m_functionList).
                       super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_functionList).
                       super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish,signature);
    if (_Var2._M_current ==
        (this->m_functionList).
        super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
      ::push_back(&this->m_functionList,signature);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline_t void Library::RegisterFunctionSignature(const FunctionSignature & signature)
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
        auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
        if (itr != m_functionList.end())
            return;
        m_functionList.push_back(signature);
	}